

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 HashmapLookupBlobKey(jx9_hashmap *pMap,void *pKey,sxu32 nKeyLen,jx9_hashmap_node **ppNode)

{
  sxu32 sVar1;
  sxi32 sVar2;
  jx9_hashmap_node *pjVar3;
  
  if (pMap->nEntry != 0) {
    sVar1 = (*pMap->xBlobHash)(pKey,nKeyLen);
    for (pjVar3 = pMap->apBucket[pMap->nSize - 1 & sVar1]; pjVar3 != (jx9_hashmap_node *)0x0;
        pjVar3 = pjVar3->pNextCollide) {
      if ((((pjVar3->iType == 2) && (pjVar3->nHash == sVar1)) &&
          ((pjVar3->xKey).sKey.nByte == nKeyLen)) &&
         (sVar2 = SyMemcmp((pjVar3->xKey).sKey.pBlob,pKey,nKeyLen), sVar2 == 0)) {
        if (ppNode == (jx9_hashmap_node **)0x0) {
          return 0;
        }
        *ppNode = pjVar3;
        return 0;
      }
    }
  }
  return -6;
}

Assistant:

static sxi32 HashmapLookupBlobKey(
	jx9_hashmap *pMap,          /* Target hashmap */
	const void *pKey,           /* Lookup key */
	sxu32 nKeyLen,              /* Key length in bytes */
	jx9_hashmap_node **ppNode   /* OUT: target node on success */
	)
{
	jx9_hashmap_node *pNode;
	sxu32 nHash;
	if( pMap->nEntry < 1 ){
		/* Don't bother hashing, there is no entry anyway */
		return SXERR_NOTFOUND;
	}
	/* Hash the key first */
	nHash = pMap->xBlobHash(pKey, nKeyLen);
	/* Point to the appropriate bucket */
	pNode = pMap->apBucket[nHash & (pMap->nSize - 1)];
	/* Perform the lookup */
	for(;;){
		if( pNode == 0 ){
			break;
		}
		if( pNode->iType == HASHMAP_BLOB_NODE 
			&& pNode->nHash == nHash
			&& SyBlobLength(&pNode->xKey.sKey) == nKeyLen 
			&& SyMemcmp(SyBlobData(&pNode->xKey.sKey), pKey, nKeyLen) == 0 ){
				/* Node found */
				if( ppNode ){
					*ppNode = pNode;
				}
				return SXRET_OK;
		}
		/* Follow the collision link */
		pNode = pNode->pNextCollide;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}